

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

bool units::wordModifiers(string *unit)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> *p_Var4;
  __tuple_element_t<3UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> *p_Var5;
  size_type sVar6;
  reference pvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_type fnd_1;
  size_type fnd;
  value_type *mod;
  const_iterator __end1;
  const_iterator __begin1;
  array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL> *__range1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  string *in_stack_fffffffffffffe50;
  char *in_stack_fffffffffffffe58;
  char __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  __const_iterator in_stack_fffffffffffffe68;
  __tuple_element_t<2UL,_tuple<const_char_*,_const_char_*,_unsigned_long,_modifier>_> __pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe80;
  allocator<char> local_51 [33];
  const_iterator local_30;
  const_iterator local_28;
  const_iterator local_20;
  array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL> *local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RDI;
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                  (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
  if ((iVar2 != 0) &&
     (iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                      (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58), iVar2 != 0))
  {
    local_18 = &wordModifiers::modifiers;
    local_20 = std::
               array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>::
               begin((array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>
                      *)0x6c26c8);
    local_28 = std::
               array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>::
               end((array<std::tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier>,_39UL>
                    *)0x6c26dc);
    for (; local_20 != local_28; local_20 = local_20 + 1) {
      local_30 = local_20;
      sVar3 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              size(local_10);
      p_Var4 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                         ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                          0x6c272c);
      if (*p_Var4 <= sVar3) {
        p_Var5 = std::get<3ul,char_const*,char_const*,unsigned_long,units::modifier>
                           ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                            0x6c274e);
        switch(*p_Var5) {
        case start_tail:
          std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2a21);
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2a39);
          iVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (in_stack_fffffffffffffe70,
                             (size_type)in_stack_fffffffffffffe68._M_current,
                             (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          if (iVar2 == 0) {
            sVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (local_10);
            p_Var4 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                               ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *
                                )0x6c2a80);
            if (sVar3 != *p_Var4) {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c2ab7);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48,
                    (size_type)in_stack_fffffffffffffe40);
              std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c2ae2);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
              return true;
            }
            return false;
          }
          break;
        case start_replace:
          in_stack_fffffffffffffe70 = local_10;
          p_Var4 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                             ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                              0x6c2c20);
          in_stack_fffffffffffffe78 = (char *)*p_Var4;
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2c35);
          iVar2 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (in_stack_fffffffffffffe70,
                             (size_type)in_stack_fffffffffffffe68._M_current,
                             (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
          if (iVar2 == 0) {
            p_Var4 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                               ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *
                                )0x6c2c6a);
            __pos = *p_Var4;
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>
                      ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2c7f
                      );
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace(in_stack_fffffffffffffe70,__pos,(size_type)local_10,in_stack_fffffffffffffe58);
            return true;
          }
          break;
        case anywhere_tail:
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2b1b);
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       (size_type)in_stack_fffffffffffffe50);
          if (sVar6 != 0xffffffffffffffff) {
            if (sVar6 == 0) {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c2baa);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              erase((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48,
                    (size_type)in_stack_fffffffffffffe40);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              push_back((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        in_stack_fffffffffffffe50,(char)((ulong)in_stack_fffffffffffffe48 >> 0x38));
            }
            else {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c2b75);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                      (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            }
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>
                      ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2be7
                      );
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50,(char *)in_stack_fffffffffffffe48);
            return true;
          }
          break;
        case anywhere_replace:
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2923);
          sVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                  find(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       (size_type)in_stack_fffffffffffffe50);
          if (sVar6 != 0xffffffffffffffff) {
            sVar3 = CLI::std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                              (local_10);
            p_Var4 = std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                               ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *
                                )0x6c2970);
            if (sVar3 != *p_Var4) {
              std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c29ba);
              std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>
                        ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)
                         0x6c29d2);
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                      (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
              return true;
            }
            return false;
          }
          break;
        case tail_replace:
          std::get<0ul,char_const*,char_const*,unsigned_long,units::modifier>
                    ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2797);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                     (allocator<char> *)in_stack_fffffffffffffe70);
          bVar1 = ends_with(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe40);
          std::allocator<char>::~allocator(local_51);
          if (bVar1) {
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            size(local_10);
            std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                      ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2850
                      );
            std::get<2ul,char_const*,char_const*,unsigned_long,units::modifier>
                      ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c2873
                      );
            std::get<1ul,char_const*,char_const*,unsigned_long,units::modifier>
                      ((tuple<const_char_*,_const_char_*,_unsigned_long,_units::modifier> *)0x6c288b
                      );
            CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            replace(in_stack_fffffffffffffe70,(size_type)in_stack_fffffffffffffe68._M_current,
                    (size_type)in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
            return true;
          }
        }
      }
    }
    pvVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             back(in_stack_fffffffffffffe40);
    bVar1 = isDigitCharacter(*pvVar7);
    if (bVar1) {
      pbVar8 = local_10;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (local_10);
      __c = (char)((ulong)pbVar8 >> 0x38);
      pvVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      if (*pvVar7 == '-') {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe48);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe48,(difference_type)in_stack_fffffffffffffe40);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,__c);
        return true;
      }
      pbVar8 = local_10;
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                (local_10);
      pvVar7 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
               ::operator[](in_stack_fffffffffffffe40,(size_type)in_stack_fffffffffffffe38);
      bVar1 = isDigitCharacter(*pvVar7);
      if (!bVar1) {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                  (pbVar8);
        __gnu_cxx::
        __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator-((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)pbVar8,(difference_type)local_10);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_10,in_stack_fffffffffffffe38);
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::insert
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe60,in_stack_fffffffffffffe68,__c);
        return true;
      }
    }
  }
  return false;
}

Assistant:

static bool wordModifiers(std::string& unit)
{
    static UNITS_CPP14_CONSTEXPR_OBJECT std::array<modSeq, 39> modifiers{{
        modSeq{"reciprocalsquare", "^-2", 16, modifier::start_tail},
        modSeq{"reciprocalcubic", "^-3", 15, modifier::start_tail},
        modSeq{"squaremeter", "m^2", 11, modifier::anywhere_tail},
        modSeq{"cubicmeter", "m^3", 10, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::start_tail},
        modSeq{"reciprocal", "^-1", 10, modifier::tail_replace},
        modSeq{"square", "^2", 6, modifier::start_tail},
        modSeq{"squared", "^2", 7, modifier::start_tail},
        modSeq{"cubed", "^2", 7, modifier::start_tail},
        modSeq{"cu", "^3", 2, modifier::start_tail},
        modSeq{"sq", "^2", 2, modifier::start_tail},
        modSeq{"tenthousand", "10000", 11, modifier::anywhere_replace},
        modSeq{"tenths", "0.1", 5, modifier::anywhere_replace},
        modSeq{"tenth", "0.1", 5, modifier::anywhere_replace},
        modSeq{"ten", "10", 3, modifier::anywhere_replace},
        modSeq{"one", "", 3, modifier::start_replace},
        modSeq{"quarter", "0.25", 7, modifier::anywhere_replace},
        modSeq{"eighth", "0.125", 6, modifier::anywhere_replace},
        modSeq{"sixteenth", "0.0625", 9, modifier::anywhere_replace},
        modSeq{"thirtyseconds", "0.03125", 13, modifier::anywhere_replace},
        modSeq{"sixtyfourths", "0.015625", 12, modifier::anywhere_replace},
        modSeq{"half", "0.5", 4, modifier::anywhere_replace},
        modSeq{"hundred", "100", 7, modifier::anywhere_replace},
        modSeq{"million", "1e6", 7, modifier::anywhere_replace},
        modSeq{"billion", "1e9", 7, modifier::anywhere_replace},
        modSeq{"trillion", "1e12", 8, modifier::anywhere_replace},
        modSeq{"thousand", "1000", 8, modifier::anywhere_replace},
        modSeq{"tothethirdpower", "^3", 15, modifier::anywhere_replace},
        modSeq{"tothefourthpower", "^4", 16, modifier::anywhere_replace},
        modSeq{"tothefifthpower", "^5", 15, modifier::anywhere_replace},
        modSeq{"tothesixthpower", "^6", 15, modifier::anywhere_replace},
        modSeq{"squared", "^2", 7, modifier::anywhere_replace},
        modSeq{"cubed", "^3", 5, modifier::anywhere_replace},
        modSeq{"square", "^2", 6, modifier::anywhere_tail},
        modSeq{"cubic", "^3", 5, modifier::anywhere_tail},
        modSeq{"sq", "^2", 2, modifier::tail_replace},
        modSeq{"cu", "^3", 2, modifier::tail_replace},
        modSeq{"u", "unit", 1, modifier::tail_replace},
    }};
    if (unit.compare(0, 3, "cup") ==
        0) {  // this causes too many issues so skip it
        return false;
    }
    if (unit.compare(0, 13, "hundredweight") ==
        0) {  // this is a specific unit and should not be cut off
        return false;
    }
    for (const auto& mod : modifiers) {
        if (unit.size() < std::get<2>(mod)) {
            continue;
        }
        switch (std::get<3>(mod)) {
            case modifier::tail_replace: {
                if (ends_with(unit, std::get<0>(mod))) {
                    unit.replace(
                        unit.size() - std::get<2>(mod),
                        std::get<2>(mod),
                        std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::anywhere_replace: {
                auto fnd = unit.find(std::get<0>(mod));
                if (fnd != std::string::npos) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.replace(fnd, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
                break;
            }
            case modifier::start_tail: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    if (unit.size() == std::get<2>(mod)) {
                        return false;
                    }
                    unit.erase(0, std::get<2>(mod));
                    unit.append(std::get<1>(mod));
                    return true;
                }
                break;
                case modifier::anywhere_tail: {
                    auto fnd = unit.find(std::get<0>(mod));
                    if (fnd != std::string::npos) {
                        // this will need to be added in again if more string
                        // are added to the search list with this type if
                        // (unit.size() == std::get<2>(mod))
                        //{
                        //    return false;
                        //}
                        if (fnd != 0) {
                            unit.replace(fnd, std::get<2>(mod), "*");
                        } else {
                            unit.erase(0, std::get<2>(mod));
                            unit.push_back('*');
                        }
                        unit.append(std::get<1>(mod));
                        return true;
                    }
                }
            } break;
            case modifier::start_replace: {
                if (unit.compare(0, std::get<2>(mod), std::get<0>(mod)) == 0) {
                    unit.replace(0, std::get<2>(mod), std::get<1>(mod));
                    return true;
                }
            } break;
        }
    }

    // deal with strings if the end is a number that didn't have a ^
    if (isDigitCharacter(unit.back())) {
        if (unit[unit.size() - 2] == '-') {
            unit.insert(unit.end() - 2, '^');
            return true;
        }
        if (!isDigitCharacter(unit[unit.size() - 2])) {
            unit.insert(unit.end() - 1, '^');
            return true;
        }
    }

    return false;
}